

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedBrs.cpp
# Opt level: O3

bool wasm::canTurnIfIntoBrIf
               (Expression *ifCondition,Expression *brValue,PassOptions *options,Module *wasm)

{
  bool bVar1;
  EffectAnalyzer local_2e8;
  undefined1 local_188 [8];
  EffectAnalyzer value;
  
  if ((ifCondition->type).id == 1) {
    return false;
  }
  if (brValue != (Expression *)0x0) {
    EffectAnalyzer::EffectAnalyzer((EffectAnalyzer *)local_188,options,wasm,brValue);
    if ((value.readsMemory != false) ||
       (bVar1 = EffectAnalyzer::hasNonTrapSideEffects((EffectAnalyzer *)local_188), bVar1)) {
      bVar1 = false;
    }
    else {
      EffectAnalyzer::EffectAnalyzer(&local_2e8,options,wasm,ifCondition);
      bVar1 = EffectAnalyzer::invalidates(&local_2e8,(EffectAnalyzer *)local_188);
      bVar1 = !bVar1;
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree(&local_2e8.delegateTargets._M_t);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree(&local_2e8.breakTargets._M_t);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree(&local_2e8.globalsWritten._M_t);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree(&local_2e8.mutableGlobalsRead._M_t);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree(&local_2e8.localsWritten._M_t);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree(&local_2e8.localsRead._M_t);
    }
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)&value.breakTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)&value.danglingPop);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)&value.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)&value.localsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)&value.localsRead._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)&value.features);
    return bVar1;
  }
  return true;
}

Assistant:

static bool canTurnIfIntoBrIf(Expression* ifCondition,
                              Expression* brValue,
                              PassOptions& options,
                              Module& wasm) {
  // if the if isn't even reached, this is all dead code anyhow
  if (ifCondition->type == Type::unreachable) {
    return false;
  }
  if (!brValue) {
    return true;
  }
  EffectAnalyzer value(options, wasm, brValue);
  if (value.hasSideEffects()) {
    return false;
  }
  return !EffectAnalyzer(options, wasm, ifCondition).invalidates(value);
}